

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzinterpolationspace.cpp
# Opt level: O2

void __thiscall
TPZInterpolationSpace::MinMaxSolutionValues
          (TPZInterpolationSpace *this,TPZVec<double> *min,TPZVec<double> *max)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  TPZIntPoints *pTVar7;
  ulong uVar8;
  long size;
  uint uVar9;
  double dVar10;
  TPZAutoPointer<TPZIntPoints> intrule;
  REAL weight;
  TPZManVector<double,_3> intpoint;
  TPZManVector<int,_3> prevorder;
  TPZManVector<int,_3> maxorder;
  TPZFNMatrix<9,_double> axes;
  TPZMaterialDataT<double> data;
  
  iVar5 = (**(code **)(*(long *)&this->super_TPZCompEl + 0xb0))();
  size = (long)iVar5;
  data.super_TPZMaterialData.super_TPZShapeData._0_8_ = 0;
  TPZManVector<double,_3>::TPZManVector(&intpoint,size,(double *)&data);
  plVar6 = (long *)(**(code **)(*(long *)&this->super_TPZCompEl + 0x2c8))(this);
  pTVar7 = (TPZIntPoints *)(**(code **)(*plVar6 + 0x48))(plVar6);
  TPZAutoPointer<TPZIntPoints>::TPZAutoPointer(&intrule,pTVar7);
  data.super_TPZMaterialData.super_TPZShapeData._0_8_ =
       data.super_TPZMaterialData.super_TPZShapeData._0_8_ & 0xffffffff00000000;
  TPZManVector<int,_3>::TPZManVector(&prevorder,size,(int *)&data);
  (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[6])((intrule.fRef)->fPointer,&prevorder);
  iVar5 = (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[7])();
  data.super_TPZMaterialData.super_TPZShapeData._0_4_ = iVar5;
  TPZManVector<int,_3>::TPZManVector(&maxorder,size,(int *)&data);
  (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[5])((intrule.fRef)->fPointer,&maxorder,0);
  data.super_TPZMaterialData.super_TPZShapeData._0_8_ = 0;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&axes,3,3,(double *)&data);
  TPZMaterialDataT<double>::TPZMaterialDataT(&data);
  iVar5 = (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[3])();
  (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[4])((intrule.fRef)->fPointer,0,&intpoint);
  ComputeSolution(this,&intpoint.super_TPZVec<double>,&data,false);
  TPZVec<double>::operator=
            (min,&(data.sol.super_TPZVec<TPZManVector<double,_10>_>.fStore)->super_TPZVec<double>);
  TPZVec<double>::operator=
            (max,&(data.sol.super_TPZVec<TPZManVector<double,_10>_>.fStore)->super_TPZVec<double>);
  uVar4 = (uint)data.sol.super_TPZVec<TPZManVector<double,_10>_>.fNElements;
  if ((int)(uint)data.sol.super_TPZVec<TPZManVector<double,_10>_>.fNElements < 1) {
    uVar4 = 0;
  }
  uVar9 = 1;
  while( true ) {
    pTVar7 = (intrule.fRef)->fPointer;
    if (iVar5 <= (int)uVar9) break;
    (*pTVar7->_vptr_TPZIntPoints[4])(pTVar7,(ulong)uVar9,&intpoint);
    ComputeSolution(this,&intpoint.super_TPZVec<double>,&data,false);
    pdVar1 = min->fStore;
    pdVar2 = max->fStore;
    for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
      pdVar3 = ((data.sol.super_TPZVec<TPZManVector<double,_10>_>.fStore)->super_TPZVec<double>).
               fStore;
      dVar10 = pdVar3[uVar8];
      if (dVar10 < pdVar1[uVar8]) {
        pdVar1[uVar8] = dVar10;
        dVar10 = pdVar3[uVar8];
      }
      pdVar3 = pdVar2 + uVar8;
      if (*pdVar3 <= dVar10 && dVar10 != *pdVar3) {
        pdVar2[uVar8] = dVar10;
      }
    }
    uVar9 = uVar9 + 1;
  }
  (*pTVar7->_vptr_TPZIntPoints[5])(pTVar7,&prevorder,0);
  TPZMaterialDataT<double>::~TPZMaterialDataT(&data);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&axes);
  TPZManVector<int,_3>::~TPZManVector(&maxorder);
  TPZManVector<int,_3>::~TPZManVector(&prevorder);
  TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer(&intrule);
  TPZManVector<double,_3>::~TPZManVector(&intpoint);
  return;
}

Assistant:

void TPZInterpolationSpace::MinMaxSolutionValues(TPZVec<STATE> &min, TPZVec<STATE> &max){
	
	const int dim = Dimension();
	TPZManVector<REAL,3> intpoint(dim,0.);
	
	TPZAutoPointer<TPZIntPoints> intrule = GetIntegrationRule().Clone();
	TPZManVector<int,3> prevorder(dim,0);
	intrule->GetOrder(prevorder);
	
	TPZManVector<int,3> maxorder(dim,intrule->GetMaxOrder());
	intrule->SetOrder(maxorder);
	
	
	TPZFNMatrix<9> axes(3,3,0.);
	REAL weight;
	TPZMaterialDataT<STATE> data;
    constexpr bool hasPhi{false};
	const int intrulepoints = intrule->NPoints();
	intrule->Point(0,intpoint,weight);
    
	this->ComputeSolution(intpoint, data,hasPhi);
	min = data.sol[0];
	max = data.sol[0];
	const int nvars = data.sol.NElements();
	for(int int_ind = 1; int_ind < intrulepoints; int_ind++){
		intrule->Point(int_ind,intpoint,weight);
		this->ComputeSolution(intpoint, data,hasPhi);
        TPZSolVec<STATE> &sol = data.sol;
		for(int iv = 0; iv < nvars; iv++){
			if (sol[0][iv] < min[iv]) min[iv] = sol[0][iv];
			if (sol[0][iv] > max[iv]) max[iv] = sol[0][iv];
		}//iv
	}//loop over integratin points
	
	intrule->SetOrder(prevorder);
	
}